

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

void nn_pipebase_sent(nn_pipebase *self)

{
  nn_fsm_event *in_RDI;
  
  if (*(char *)((long)&in_RDI[2].srcptr + 2) == '\x02') {
    *(undefined1 *)((long)&in_RDI[2].srcptr + 2) = 3;
  }
  else {
    if (*(char *)((long)&in_RDI[2].srcptr + 2) != '\x04') {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
              "self->outstate == NN_PIPEBASE_OUTSTATE_ASYNC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/pipe.c"
              ,0x76);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined1 *)((long)&in_RDI[2].srcptr + 2) = 1;
    nn_fsm_raise(&self->fsm,in_RDI,0);
  }
  return;
}

Assistant:

void nn_pipebase_sent (struct nn_pipebase *self)
{
    if (nn_fast (self->outstate == NN_PIPEBASE_OUTSTATE_SENDING)) {
        self->outstate = NN_PIPEBASE_OUTSTATE_SENT;
        return;
    }
    nn_assert (self->outstate == NN_PIPEBASE_OUTSTATE_ASYNC);
    self->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
    nn_fsm_raise (&self->fsm, &self->out, NN_PIPE_OUT);
}